

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPF.cpp
# Opt level: O0

bool __thiscall
OpenMD::RNEMD::SPFMethod::getSelectedMolecule(SPFMethod *this,shared_ptr<OpenMD::SPFData> *spfData)

{
  Molecule *selectedMolecule_00;
  SPFMethod *in_RSI;
  long in_RDI;
  RealType RVar1;
  Molecule *selectedMolecule;
  Molecule *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffe8;
  int index;
  SPFMethod *this_00;
  
  index = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  this_00 = in_RSI;
  std::__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x3f6c93);
  selectedMolecule_00 = SimInfo::getMoleculeByGlobalIndex((SimInfo *)this_00,index);
  if (selectedMolecule_00 != (Molecule *)0x0) {
    if ((*(byte *)(in_RDI + 0x28a) & 1) != 0) {
      RVar1 = Molecule::getFixedCharge((Molecule *)this_00);
      if (RVar1 < 0.0) {
        *(double *)(in_RDI + 0x1f88) = *(double *)(in_RDI + 0x1f88) * -1.0;
      }
      convertParticlesToElectrons(in_RSI,in_stack_ffffffffffffffc8);
    }
    SPFForceManager::setSelectedMolecule(*(SPFForceManager **)(in_RDI + 0x22b0),selectedMolecule_00)
    ;
  }
  return true;
}

Assistant:

bool SPFMethod::getSelectedMolecule(std::shared_ptr<SPFData> spfData) {
    Molecule* selectedMolecule;

    selectedMolecule = info_->getMoleculeByGlobalIndex(spfData->globalID);

    if (selectedMolecule) {
      if (useChargedSPF_) {
        if (selectedMolecule->getFixedCharge() < 0.0) { spfTarget_ *= -1; }

        // Scale the particle flux by the charge yielding a current density
        convertParticlesToElectrons(selectedMolecule);
      }

      forceManager_->setSelectedMolecule(selectedMolecule);
    }

    return true;
  }